

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

void __thiscall embree::Texture::~Texture(Texture *this)

{
  long in_RDI;
  
  alignedUSMFree((void *)0x1b8fcc);
  std::__cxx11::string::~string((string *)(in_RDI + 0x20));
  return;
}

Assistant:

Texture::~Texture () {
    alignedUSMFree(data);
  }